

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

void __thiscall svg::Font::~Font(Font *this)

{
  pointer pcVar1;
  
  (this->super_Serializeable)._vptr_Serializeable = (_func_int **)&PTR__Font_0010ecd8;
  pcVar1 = (this->family)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->family).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

Font(double size = 12, std::string const & family = "Verdana") : size(size), family(family) { }